

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DefaultFBOMultisampleCase::readImage
          (DefaultFBOMultisampleCase *this,Surface *dst)

{
  int x;
  int y;
  RenderContext *context;
  void *data;
  TextureFormat local_50;
  PixelBufferAccess local_48;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  x = this->m_viewportX;
  y = this->m_viewportY;
  local_50.order = RGBA;
  local_50.type = UNORM_INT8;
  data = (void *)(dst->m_pixels).m_cap;
  if (data != (void *)0x0) {
    data = (dst->m_pixels).m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess(&local_48,&local_50,dst->m_width,dst->m_height,1,data);
  glu::readPixels(context,x,y,&local_48);
  return;
}

Assistant:

void DefaultFBOMultisampleCase::readImage (tcu::Surface& dst) const
{
	glu::readPixels(m_context.getRenderContext(), m_viewportX, m_viewportY, dst.getAccess());
}